

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::DictionaryType::DictionaryType
          (DictionaryType *this,DictionaryType *from)

{
  ulong uVar1;
  ValueType *pVVar2;
  ValueType *pVVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DictionaryType_00484b88;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  pVVar2 = from->keytype_;
  if (pVVar2 == (ValueType *)0x0 || from == (DictionaryType *)_DictionaryType_default_instance_) {
    pVVar3 = (ValueType *)0x0;
  }
  else {
    pVVar3 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(pVVar3,pVVar2);
  }
  this->keytype_ = pVVar3;
  pVVar2 = from->valuetype_;
  if (pVVar2 == (ValueType *)0x0 || from == (DictionaryType *)_DictionaryType_default_instance_) {
    pVVar3 = (ValueType *)0x0;
  }
  else {
    pVVar3 = (ValueType *)operator_new(0x20);
    ValueType::ValueType(pVVar3,pVVar2);
  }
  this->valuetype_ = pVVar3;
  return;
}

Assistant:

DictionaryType::DictionaryType(const DictionaryType& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_keytype()) {
    keytype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.keytype_);
  } else {
    keytype_ = nullptr;
  }
  if (from._internal_has_valuetype()) {
    valuetype_ = new ::CoreML::Specification::MILSpec::ValueType(*from.valuetype_);
  } else {
    valuetype_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.DictionaryType)
}